

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
emplaceRealloc<slang::ast::DefinitionSymbol::ParameterDecl_const&>
          (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *this,pointer pos,
          ParameterDecl *args)

{
  size_t *psVar1;
  SourceLocation *pSVar2;
  ulong uVar3;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar4;
  anon_union_8_3_4d6ead1c_for_ParameterDecl_2 aVar5;
  size_t sVar6;
  char *pcVar7;
  SourceLocation SVar8;
  SourceLocation SVar9;
  size_t sVar10;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar11;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar12;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar13;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar14;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar15;
  ParameterDecl *__cur_1;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar16;
  pointer pPVar17;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar18;
  pointer pPVar19;
  EVP_PKEY_CTX *pEVar20;
  EVP_PKEY_CTX *ctx;
  long lVar21;
  
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar20 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar3 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar3 * 2);
  if (pEVar20 < ctx) {
    pEVar20 = ctx;
  }
  if (0x1ffffffffffffff - uVar3 < uVar3) {
    pEVar20 = (EVP_PKEY_CTX *)0x1ffffffffffffff;
  }
  lVar21 = (long)pos - (long)this->data_;
  paVar16 = (anon_union_8_3_62382250_for_ParameterDecl_0 *)operator_new((long)pEVar20 << 6);
  aVar4 = args->field_0;
  aVar5 = args->field_1;
  sVar6 = (args->name)._M_len;
  pcVar7 = (args->name)._M_str;
  SVar8 = args->location;
  SVar9 = (SourceLocation)(args->attributes)._M_ptr;
  sVar10 = *(size_t *)&args->isTypeParam;
  psVar1 = (size_t *)((long)paVar16 + lVar21 + 0x30);
  *psVar1 = (args->attributes)._M_extent._M_extent_value;
  psVar1[1] = sVar10;
  pSVar2 = (SourceLocation *)((long)paVar16 + lVar21 + 0x20);
  *pSVar2 = SVar8;
  pSVar2[1] = SVar9;
  psVar1 = (size_t *)((long)paVar16 + lVar21 + 0x10);
  *psVar1 = sVar6;
  psVar1[1] = (size_t)pcVar7;
  *(anon_union_8_3_62382250_for_ParameterDecl_0 *)((long)paVar16 + lVar21) = aVar4;
  *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)
   ((anon_union_8_3_62382250_for_ParameterDecl_0 *)((long)paVar16 + lVar21) + 1) = aVar5;
  pPVar19 = this->data_;
  pPVar17 = pPVar19 + this->len;
  paVar18 = paVar16;
  if (pPVar17 == pos) {
    for (; pPVar19 != pos; pPVar19 = pPVar19 + 1) {
      aVar4 = pPVar19->field_0;
      aVar5 = pPVar19->field_1;
      aVar11 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar19->name)._M_len;
      aVar12 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar19->name)._M_str;
      aVar13 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar19->location;
      aVar14 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar19->attributes)._M_ptr;
      aVar15 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar19->isTypeParam;
      paVar18[6] = (anon_union_8_3_62382250_for_ParameterDecl_0)
                   (pPVar19->attributes)._M_extent._M_extent_value;
      paVar18[7] = aVar15;
      paVar18[4] = aVar13;
      paVar18[5] = aVar14;
      paVar18[2] = aVar11;
      paVar18[3] = aVar12;
      *paVar18 = aVar4;
      *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(paVar18 + 1) = aVar5;
      paVar18 = paVar18 + 8;
    }
  }
  else {
    for (; pPVar19 != pos; pPVar19 = pPVar19 + 1) {
      aVar4 = pPVar19->field_0;
      aVar5 = pPVar19->field_1;
      aVar11 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar19->name)._M_len;
      aVar12 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar19->name)._M_str;
      aVar13 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar19->location;
      aVar14 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar19->attributes)._M_ptr;
      aVar15 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar19->isTypeParam;
      paVar18[6] = (anon_union_8_3_62382250_for_ParameterDecl_0)
                   (pPVar19->attributes)._M_extent._M_extent_value;
      paVar18[7] = aVar15;
      paVar18[4] = aVar13;
      paVar18[5] = aVar14;
      paVar18[2] = aVar11;
      paVar18[3] = aVar12;
      *paVar18 = aVar4;
      *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(paVar18 + 1) = aVar5;
      paVar18 = paVar18 + 8;
    }
    paVar18 = (anon_union_8_3_62382250_for_ParameterDecl_0 *)(lVar21 + (long)paVar16);
    for (; pos != pPVar17; pos = pos + 1) {
      aVar4 = pos->field_0;
      aVar5 = pos->field_1;
      aVar11 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pos->name)._M_len;
      aVar12 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pos->name)._M_str;
      aVar13 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pos->location;
      aVar14 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pos->attributes)._M_ptr;
      aVar15 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pos->isTypeParam;
      paVar18[0xe] = (anon_union_8_3_62382250_for_ParameterDecl_0)
                     (pos->attributes)._M_extent._M_extent_value;
      paVar18[0xf] = aVar15;
      paVar18[0xc] = aVar13;
      paVar18[0xd] = aVar14;
      paVar18[10] = aVar11;
      paVar18[0xb] = aVar12;
      paVar18[8] = aVar4;
      *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(paVar18 + 9) = aVar5;
      paVar18 = paVar18 + 8;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar20;
  this->data_ = (pointer)paVar16;
  return (pointer)((long)paVar16 + lVar21);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}